

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O3

void __thiscall chrono::ChBody::ChBody(ChBody *this,void **vtt,ChBody *other)

{
  ChLoadableUVW CVar1;
  _func_int **pp_Var2;
  pointer psVar3;
  pointer psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar5;
  ulong uVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  pointer psVar13;
  pointer psVar14;
  ulong uVar15;
  ulong uVar16;
  vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
  *__range1;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 local_51;
  vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  *local_50;
  undefined1 local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48;
  ChPhysicsItem::ChPhysicsItem(&this->super_ChPhysicsItem,&other->super_ChPhysicsItem);
  ChFrameMoving<double>::ChFrameMoving
            (&(this->super_ChBodyFrame).super_ChFrameMoving<double>,
             &(other->super_ChBodyFrame).super_ChFrameMoving<double>);
  (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>._vptr_ChFrame =
       (_func_int **)&PTR__ChFrame_00b04070;
  (this->super_ChContactable_1vars<6>).super_ChContactable.m_data.
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (this->super_ChContactable_1vars<6>).super_ChContactable._vptr_ChContactable =
       (_func_int **)&PTR__ChContactable_1vars_00b048a0;
  (this->super_ChContactable_1vars<6>).super_ChVariableTupleCarrier_1vars<6>.
  _vptr_ChVariableTupleCarrier_1vars = (_func_int **)&PTR__ChContactable_1vars_00b04948;
  CVar1 = *(ChLoadableUVW *)(vtt + 1);
  this->super_ChLoadableUVW = CVar1;
  *(void **)((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(&this->gyro + -4) + 2) +
            *(long *)((long)CVar1 + -0x78)) = vtt[2];
  pp_Var2 = (_func_int **)*vtt;
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = pp_Var2;
  (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>._vptr_ChFrame =
       (_func_int **)0xb04428;
  (this->super_ChContactable_1vars<6>).super_ChContactable._vptr_ChContactable =
       (_func_int **)0xb044c0;
  (this->super_ChContactable_1vars<6>).super_ChVariableTupleCarrier_1vars<6>.
  _vptr_ChVariableTupleCarrier_1vars = (_func_int **)(vtable + 0x458);
  this->super_ChLoadableUVW = *(ChLoadableUVW *)(vtt + 3);
  *(void **)(pp_Var2[-3] +
            (long)(&(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                    coord.pos + -6) + 0x10) = vtt[4];
  (this->collision_model).
  super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>)0x0;
  auVar21 = ZEXT1664((undefined1  [16])0x0);
  local_50 = &this->forcelist;
  auVar17 = vmovdqu64_avx512f(auVar21);
  *(undefined1 (*) [64])((this->gyro).m_data + 2) = auVar17;
  auVar17 = vmovdqu64_avx512f(auVar21);
  this->marklist =
       (vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
        )auVar17._0_24_;
  this->forcelist =
       (vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
       )auVar17._24_24_;
  (this->gyro).m_data[0] = (double)auVar17._48_8_;
  (this->gyro).m_data[1] = (double)auVar17._56_8_;
  auVar17 = vmovdqu64_avx512f(auVar21);
  *(undefined1 (*) [64])((this->Xtorque).m_data + 1) = auVar17;
  ChVariablesBodyOwnMass::ChVariablesBodyOwnMass(&this->variables);
  this->bflags = other->bflags;
  ChVariablesBodyOwnMass::operator=(&this->variables,&other->variables);
  (this->variables).super_ChVariablesBody.user_data = this;
  if (other != this) {
    (this->gyro).m_data[0] = (other->gyro).m_data[0];
    (this->gyro).m_data[1] = (other->gyro).m_data[1];
    (this->gyro).m_data[2] = (other->gyro).m_data[2];
  }
  psVar13 = (this->forcelist).
            super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->forcelist).
           super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar13 != psVar3) {
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxbd_avx2(ZEXT816(0x7060504030201000));
    lVar7 = -0x10 - (long)psVar13;
    auVar21 = vpbroadcastq_avx512f();
    auVar21 = vpsrlq_avx512f(auVar21,4);
    uVar16 = 0;
    do {
      auVar18 = vpbroadcastq_avx512f();
      uVar15 = uVar16 + 8;
      auVar18 = vporq_avx512f(auVar18,auVar17);
      uVar6 = vpcmpuq_avx512f(auVar18,auVar21,2);
      auVar18 = vpgatherdq_avx512f(*(undefined4 *)
                                    ((long)&(psVar13->
                                            super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_refcount._M_pi + uVar16));
      auVar19._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar18._8_8_;
      auVar19._0_8_ = (ulong)((byte)uVar6 & 1) * auVar18._0_8_;
      auVar19._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar18._16_8_;
      auVar19._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar18._24_8_;
      auVar19._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar18._32_8_;
      auVar19._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar18._40_8_;
      auVar19._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar18._48_8_;
      auVar19._56_8_ = (uVar6 >> 7) * auVar18._56_8_;
      psVar13 = psVar13 + 8;
      vpscatterqq_avx512f(ZEXT864(0x38) + auVar19,uVar6,ZEXT1664((undefined1  [16])0x0));
      uVar16 = uVar15;
    } while ((((ulong)((long)psVar3 + lVar7) >> 4) + 8 & 0x1ffffffffffffff8) != uVar15);
  }
  std::vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ::clear(local_50);
  psVar14 = (this->marklist).
            super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (this->marklist).
           super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar14 != psVar4) {
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxbd_avx2(ZEXT816(0x7060504030201000));
    lVar7 = -0x10 - (long)psVar14;
    auVar21 = vpbroadcastq_avx512f();
    auVar21 = vpsrlq_avx512f(auVar21,4);
    uVar16 = 0;
    do {
      auVar18 = vpbroadcastq_avx512f();
      uVar15 = uVar16 + 8;
      auVar18 = vporq_avx512f(auVar18,auVar17);
      uVar6 = vpcmpuq_avx512f(auVar18,auVar21,2);
      auVar18 = vpgatherdq_avx512f(*(undefined4 *)
                                    ((long)&(psVar14->
                                            super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_refcount._M_pi + uVar16));
      auVar20._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar18._8_8_;
      auVar20._0_8_ = (ulong)((byte)uVar6 & 1) * auVar18._0_8_;
      auVar20._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar18._16_8_;
      auVar20._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar18._24_8_;
      auVar20._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar18._32_8_;
      auVar20._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar18._40_8_;
      auVar20._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar18._48_8_;
      auVar20._56_8_ = (uVar6 >> 7) * auVar18._56_8_;
      psVar14 = psVar14 + 8;
      vpscatterqq_avx512f(ZEXT864(400) + auVar20,uVar6,ZEXT1664((undefined1  [16])0x0));
      uVar16 = uVar15;
    } while ((((ulong)((long)psVar4 + lVar7) >> 4) + 8 & 0x1ffffffffffffff8) != uVar15);
  }
  std::
  vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>::
  clear(&this->marklist);
  (this->super_ChPhysicsItem).super_ChObj.ChTime = (other->super_ChPhysicsItem).super_ChObj.ChTime;
  local_48 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::collision::ChCollisionModelBullet,std::allocator<chrono::collision::ChCollisionModelBullet>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8),
             (ChCollisionModelBullet **)local_48,
             (allocator<chrono::collision::ChCollisionModelBullet> *)&local_51);
  _Var12._M_pi = a_Stack_40[0]._M_pi;
  auVar11 = local_48;
  _local_48 = (undefined1  [16])0x0;
  this_00 = (this->collision_model).
            super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->collision_model).
  super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auVar11;
  (this->collision_model).
  super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var12._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
  }
  peVar5 = (this->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar5->_vptr_ChCollisionModel[0x16])(peVar5,&this->super_ChContactable_1vars<6>);
  this->density = other->density;
  this->sleep_starttime = other->sleep_starttime;
  fVar8 = other->max_wvel;
  fVar9 = other->sleep_time;
  fVar10 = other->sleep_minspeed;
  this->max_speed = other->max_speed;
  this->max_wvel = fVar8;
  this->sleep_time = fVar9;
  this->sleep_minspeed = fVar10;
  this->sleep_minwvel = other->sleep_minwvel;
  return;
}

Assistant:

ChBody::ChBody(const ChBody& other) : ChPhysicsItem(other), ChBodyFrame(other) {
    bflags = other.bflags;

    variables = other.variables;
    variables.SetUserData((void*)this);

    gyro = other.gyro;

    RemoveAllForces();   // also copy-duplicate the forces? Let the user handle this..
    RemoveAllMarkers();  // also copy-duplicate the markers? Let the user handle this..

    ChTime = other.ChTime;

    // also copy-duplicate the collision model? Let the user handle this..
    collision_model = chrono_types::make_shared<ChCollisionModelBullet>();
    collision_model->SetContactable(this);

    density = other.density;

    max_speed = other.max_speed;
    max_wvel = other.max_wvel;

    sleep_time = other.sleep_time;
    sleep_starttime = other.sleep_starttime;
    sleep_minspeed = other.sleep_minspeed;
    sleep_minwvel = other.sleep_minwvel;
}